

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

void __thiscall ImGui::SFML::Shutdown(SFML *this,Window *window)

{
  WindowContext *this_00;
  WindowContext *pWVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ImGuiContext *ctx;
  __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>_>
  _Var5;
  unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
  *puVar6;
  __normal_iterator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>_>
  __it;
  SFML *local_48;
  WindowHandle local_40;
  WindowHandle local_38;
  
  local_38 = sf::Window::getSystemHandle((anonymous_namespace)::s_currWindowCtx->window);
  local_40 = sf::Window::getSystemHandle((Window *)this);
  puVar6 = DAT_0021b150;
  lVar3 = (long)DAT_0021b150 - (long)(anonymous_namespace)::s_windowContexts;
  __it._M_current = (anonymous_namespace)::s_windowContexts;
  local_48 = this;
  for (lVar4 = lVar3 >> 5; _Var5._M_current = __it._M_current, 0 < lVar4; lVar4 = lVar4 + -1) {
    window = (Window *)__it._M_current;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::$_0>::operator()
                      ((_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::__0> *)&local_48,__it);
    if (bVar2) goto LAB_0013d2a1;
    _Var5._M_current = __it._M_current + 1;
    window = (Window *)_Var5._M_current;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::$_0>::operator()
                      ((_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::__0> *)&local_48,_Var5)
    ;
    if (bVar2) goto LAB_0013d2a1;
    _Var5._M_current = __it._M_current + 2;
    window = (Window *)_Var5._M_current;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::$_0>::operator()
                      ((_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::__0> *)&local_48,_Var5)
    ;
    if (bVar2) goto LAB_0013d2a1;
    _Var5._M_current = __it._M_current + 3;
    window = (Window *)_Var5._M_current;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::$_0>::operator()
                      ((_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::__0> *)&local_48,_Var5)
    ;
    if (bVar2) goto LAB_0013d2a1;
    __it._M_current = __it._M_current + 4;
    lVar3 = lVar3 + -0x20;
  }
  lVar3 = lVar3 >> 3;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      _Var5._M_current = puVar6;
      if ((lVar3 != 3) ||
         (window = (Window *)__it._M_current,
         bVar2 = __gnu_cxx::__ops::_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::$_0>::
                 operator()((_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::__0> *)&local_48,
                            __it), _Var5._M_current = __it._M_current, bVar2)) goto LAB_0013d2a1;
      _Var5._M_current = __it._M_current + 1;
    }
    window = (Window *)_Var5._M_current;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::$_0>::operator()
                      ((_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::__0> *)&local_48,_Var5)
    ;
    if (bVar2) goto LAB_0013d2a1;
    __it._M_current = _Var5._M_current + 1;
  }
  window = (Window *)__it._M_current;
  bVar2 = __gnu_cxx::__ops::_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::$_0>::operator()
                    ((_Iter_pred<ImGui::SFML::Shutdown(sf::Window_const&)::__0> *)&local_48,__it);
  _Var5._M_current = puVar6;
  if (bVar2) {
    _Var5._M_current = __it._M_current;
  }
LAB_0013d2a1:
  if (_Var5._M_current == DAT_0021b150) {
    __assert_fail("found != s_windowContexts.end() && \"Window wasn\'t inited properly: forgot to call ImGui::SFML::Init(window)?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x21b,"void ImGui::SFML::Shutdown(const sf::Window &)");
  }
  puVar6 = _Var5._M_current + 1;
  if (puVar6 != DAT_0021b150) {
    for (lVar3 = (long)DAT_0021b150 - (long)puVar6 >> 3; 0 < lVar3; lVar3 = lVar3 + -1) {
      this_00 = puVar6[-1]._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
                .super__Head_base<0UL,_(anonymous_namespace)::WindowContext_*,_false>._M_head_impl;
      pWVar1 = (puVar6->_M_t).
               super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
               .super__Head_base<0UL,_(anonymous_namespace)::WindowContext_*,_false>._M_head_impl;
      (puVar6->_M_t).
      super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
      .super__Head_base<0UL,_(anonymous_namespace)::WindowContext_*,_false>._M_head_impl =
           (WindowContext *)0x0;
      puVar6[-1]._M_t.
      super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
      ._M_t.
      super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
      .super__Head_base<0UL,_(anonymous_namespace)::WindowContext_*,_false>._M_head_impl = pWVar1;
      if (this_00 != (WindowContext *)0x0) {
        std::default_delete<(anonymous_namespace)::WindowContext>::operator()
                  ((default_delete<(anonymous_namespace)::WindowContext> *)this_00,
                   (WindowContext *)window);
      }
      puVar6 = puVar6 + 1;
    }
  }
  DAT_0021b150 = DAT_0021b150 + -1;
  std::
  unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
  ::~unique_ptr(DAT_0021b150);
  if (local_38 != local_40) {
    return;
  }
  if ((anonymous_namespace)::s_windowContexts == DAT_0021b150) {
    (anonymous_namespace)::s_currWindowCtx = (WindowContext *)0x0;
    ctx = (ImGuiContext *)0x0;
  }
  else {
    (anonymous_namespace)::s_currWindowCtx =
         ((anonymous_namespace)::s_windowContexts->_M_t).
         super___uniq_ptr_impl<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
         ._M_t.
         super__Tuple_impl<0UL,_(anonymous_namespace)::WindowContext_*,_std::default_delete<(anonymous_namespace)::WindowContext>_>
         .super__Head_base<0UL,_(anonymous_namespace)::WindowContext_*,_false>._M_head_impl;
    ctx = (anonymous_namespace)::s_currWindowCtx->imContext;
  }
  SetCurrentContext(ctx);
  return;
}

Assistant:

void Shutdown(const sf::Window& window) {
    bool needReplacement = (s_currWindowCtx->window->getSystemHandle() == window.getSystemHandle());

    // remove window's context
    auto found = std::find_if(s_windowContexts.begin(), s_windowContexts.end(),
                              [&](std::unique_ptr<WindowContext>& ctx) {
                                  return ctx->window->getSystemHandle() == window.getSystemHandle();
                              });
    assert(found != s_windowContexts.end() &&
           "Window wasn't inited properly: forgot to call ImGui::SFML::Init(window)?");
    s_windowContexts.erase(found); // s_currWindowCtx can become invalid here!

    // set current context to some window for convenience if needed
    if (needReplacement) {
        auto it = s_windowContexts.begin();
        if (it != s_windowContexts.end()) {
            // set to some other window
            s_currWindowCtx = it->get();
            ImGui::SetCurrentContext(s_currWindowCtx->imContext);
        } else {
            // no alternatives...
            s_currWindowCtx = nullptr;
            ImGui::SetCurrentContext(nullptr);
        }
    }
}